

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::UdpInputPortDeclSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,UdpInputPortDeclSyntax *this,size_t index)

{
  Token token;
  SyntaxNode *local_60;
  SyntaxNode *local_50;
  size_t index_local;
  UdpInputPortDeclSyntax *this_local;
  
  if (index == 0) {
    local_50 = (SyntaxNode *)0x0;
    if (this != (UdpInputPortDeclSyntax *)0xfffffffffffffff0) {
      local_50 = &(this->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_50);
  }
  else if (index == 1) {
    token.kind = (this->keyword).kind;
    token._2_1_ = (this->keyword).field_0x2;
    token.numFlags.raw = (this->keyword).numFlags.raw;
    token.rawLen = (this->keyword).rawLen;
    token.info = (this->keyword).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 2) {
    local_60 = (SyntaxNode *)0x0;
    if (this != (UdpInputPortDeclSyntax *)0xffffffffffffffb0) {
      local_60 = &(this->names).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_60);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax UdpInputPortDeclSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return keyword;
        case 2: return &names;
        default: return nullptr;
    }
}